

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O0

void finish(warm_cb *data)

{
  uint32_t uVar1;
  ostream *poVar2;
  void *pvVar3;
  reference pvVar4;
  vector<example_*,_std::allocator<example_*>_> *pvVar5;
  reference ppeVar6;
  long in_RDI;
  size_t i;
  size_t a_1;
  size_t a;
  uint32_t argmin;
  v_array<ACTION_SCORE::action_score> *in_stack_ffffffffffffff60;
  example *in_stack_ffffffffffffff68;
  vector<example_*,_std::allocator<example_*>_> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffb0;
  vector<example_*,_std::allocator<example_*>_> *this;
  vector<example_*,_std::allocator<example_*>_> *__n;
  ulong local_48;
  ulong local_40;
  
  (*(code *)PTR_delete_label_0049cdd8)(in_RDI);
  v_array<ACTION_SCORE::action_score>::delete_v(in_stack_ffffffffffffff60);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffffb0,
             (vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  uVar1 = find_min<float>((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff70);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff70);
  if ((*(byte *)(*(long *)(in_RDI + 0x50) + 0x3439) & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"average variance estimate = ");
    pvVar3 = (void *)std::ostream::operator<<
                               (poVar2,*(float *)(in_RDI + 0x130) / (float)*(uint *)(in_RDI + 0x138)
                               );
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cerr,"theoretical average variance = ");
    pvVar3 = (void *)std::ostream::operator<<
                               (poVar2,(float)*(uint *)(in_RDI + 0xa8) / *(float *)(in_RDI + 0xac));
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cerr,"last lambda chosen = ");
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0xb0),(ulong)uVar1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4);
    poVar2 = std::operator<<(poVar2," among lambdas ranging from ");
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0xb0),0);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar4);
    poVar2 = std::operator<<(poVar2," to ");
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0xb0),
                        (ulong)(*(int *)(in_RDI + 0x80) - 1));
    pvVar3 = (void *)std::ostream::operator<<(poVar2,*pvVar4);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  for (local_40 = 0; local_40 < *(uint *)(in_RDI + 0xa8); local_40 = local_40 + 1) {
    (*(code *)PTR_delete_label_0049cd48)(*(long *)(in_RDI + 0x168) + local_40 * 0x20);
  }
  free(*(void **)(in_RDI + 0x168));
  free(*(void **)(in_RDI + 0x170));
  for (local_48 = 0; local_48 < *(uint *)(in_RDI + 0xa8); local_48 = local_48 + 1) {
    std::vector<example_*,_std::allocator<example_*>_>::operator[]
              ((vector<example_*,_std::allocator<example_*>_> *)(in_RDI + 0x58),local_48);
    v_array<ACTION_SCORE::action_score>::delete_v(in_stack_ffffffffffffff60);
    std::vector<example_*,_std::allocator<example_*>_>::operator[]
              ((vector<example_*,_std::allocator<example_*>_> *)(in_RDI + 0x58),local_48);
    VW::dealloc_example((_func_void_void_ptr *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                        (_func_void_void_ptr *)in_stack_ffffffffffffff60);
    std::vector<example_*,_std::allocator<example_*>_>::operator[]
              ((vector<example_*,_std::allocator<example_*>_> *)(in_RDI + 0x58),local_48);
    free_it((void *)0x29ce79);
  }
  std::vector<example_*,_std::allocator<example_*>_>::~vector(in_stack_ffffffffffffff70);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff70);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff70);
  v_array<ACTION_SCORE::action_score>::delete_v(in_stack_ffffffffffffff60);
  this = (vector<example_*,_std::allocator<example_*>_> *)0x0;
  while( true ) {
    __n = this;
    pvVar5 = (vector<example_*,_std::allocator<example_*>_> *)
             std::vector<example_*,_std::allocator<example_*>_>::size
                       ((vector<example_*,_std::allocator<example_*>_> *)(in_RDI + 0x118));
    if (pvVar5 <= this) break;
    if ((*(byte *)(in_RDI + 0x178) & 1) == 0) {
      in_stack_ffffffffffffff60 = (v_array<ACTION_SCORE::action_score> *)MULTICLASS::mc_label._32_8_
      ;
      std::vector<example_*,_std::allocator<example_*>_>::operator[]
                ((vector<example_*,_std::allocator<example_*>_> *)(in_RDI + 0x118),(size_type)__n);
      VW::dealloc_example((_func_void_void_ptr *)this,in_stack_ffffffffffffff68,
                          (_func_void_void_ptr *)in_stack_ffffffffffffff60);
    }
    else {
      in_stack_ffffffffffffff68 = (example *)PTR_delete_label_0049cd48;
      std::vector<example_*,_std::allocator<example_*>_>::operator[]
                ((vector<example_*,_std::allocator<example_*>_> *)(in_RDI + 0x118),(size_type)__n);
      VW::dealloc_example((_func_void_void_ptr *)this,in_stack_ffffffffffffff68,
                          (_func_void_void_ptr *)in_stack_ffffffffffffff60);
    }
    ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        ((vector<example_*,_std::allocator<example_*>_> *)(in_RDI + 0x118),
                         (size_type)__n);
    free(*ppeVar6);
    this = (vector<example_*,_std::allocator<example_*>_> *)
           ((long)&(__n->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_start + 1);
  }
  std::vector<example_*,_std::allocator<example_*>_>::~vector(this);
  return;
}

Assistant:

void finish(warm_cb& data)
{
  CB::cb_label.delete_label(&data.cb_label);
  data.a_s.delete_v();

	uint32_t argmin = find_min(data.cumulative_costs);

  if (!data.all->quiet)
  {
  	cerr << "average variance estimate = " << data.cumu_var / data.inter_iter << endl;
  	cerr << "theoretical average variance = " << data.num_actions / data.epsilon << endl;
  	cerr << "last lambda chosen = " << data.lambdas[argmin] << " among lambdas ranging from " << data.lambdas[0] << " to " << data.lambdas[data.choices_lambda-1] << endl;
  }

	for (size_t a = 0; a < data.num_actions; ++a)
	{
		COST_SENSITIVE::cs_label.delete_label(&data.csls[a]);
	}
	free(data.csls);
	free(data.cbls);

  for (size_t a = 0; a < data.num_actions; ++a)
    {
      data.ecs[a]->pred.a_s.delete_v();
      VW::dealloc_example(CB::cb_label.delete_label, *data.ecs[a]);
      free_it(data.ecs[a]);
    }
  data.ecs.~vector<example*>();

	data.lambdas.~vector<float>();
	data.cumulative_costs.~vector<float>();

	data.a_s_adf.delete_v();
	for (size_t i = 0; i < data.ws_vali.size(); ++i)
	{
		if (data.use_cs)
			VW::dealloc_example(COST_SENSITIVE::cs_label.delete_label, *data.ws_vali[i]);
		else
			VW::dealloc_example(MULTICLASS::mc_label.delete_label, *data.ws_vali[i]);
		free(data.ws_vali[i]);
	}
	data.ws_vali.~vector<example*>();
}